

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackDebGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackDebGenerator *this,string *componentName)

{
  ComponentPackageMethod CVar1;
  char *pcVar2;
  string groupVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
  if (CVar1 == ONE_PACKAGE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ALL_COMPONENTS_IN_ONE",(allocator<char> *)&local_80
              );
  }
  else if (CVar1 == ONE_PACKAGE_PER_COMPONENT) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)componentName);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_40,componentName);
    std::operator+(&local_60,"CPACK_COMPONENT_",&local_40);
    std::operator+(&local_80,&local_60,"_GROUP");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_80);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)componentName);
    }
    else {
      pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)&local_60);
    }
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackDebGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  if (componentPackageMethod == ONE_PACKAGE_PER_COMPONENT) {
    return componentName;
  }

  if (componentPackageMethod == ONE_PACKAGE) {
    return std::string("ALL_COMPONENTS_IN_ONE");
  }
  // We have to find the name of the COMPONENT GROUP
  // the current COMPONENT belongs to.
  std::string groupVar =
    "CPACK_COMPONENT_" + cmSystemTools::UpperCase(componentName) + "_GROUP";
  if (nullptr != GetOption(groupVar)) {
    return std::string(GetOption(groupVar));
  }
  return componentName;
}